

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::loadModel(FastText *this,istream *in)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  invalid_argument *this_01;
  element_type *peVar3;
  Dictionary *in_RSI;
  long in_RDI;
  bool quant_input;
  istream *in_stack_fffffffffffffea8;
  Model *in_stack_fffffffffffffeb0;
  Model *this_02;
  undefined8 in_stack_fffffffffffffeb8;
  undefined1 qout;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffec0;
  vector<long,_std::allocator<long>_> *this_03;
  shared_ptr<fasttext::QMatrix> *qwi;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  byte bVar4;
  shared_ptr<fasttext::Args> *in_stack_fffffffffffffed8;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffee0;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffee8;
  entry_type type;
  istream *in_stack_fffffffffffffef8;
  Dictionary *this_04;
  Matrix *in_stack_ffffffffffffff00;
  undefined1 local_f0 [48];
  undefined1 local_c0 [36];
  undefined4 local_9c;
  shared_ptr<fasttext::QMatrix> local_98;
  istream *in_stack_ffffffffffffff78;
  QMatrix *in_stack_ffffffffffffff80;
  byte local_71 [97];
  Dictionary *local_10;
  
  qout = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
  local_10 = in_RSI;
  std::make_shared<fasttext::Args>();
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffeb0,
             (shared_ptr<fasttext::Args> *)in_stack_fffffffffffffea8);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x16a4b0);
  std::make_shared<fasttext::Matrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            (&in_stack_fffffffffffffeb0->wi_,
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffea8);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x16a4e0);
  std::make_shared<fasttext::Matrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            (&in_stack_fffffffffffffeb0->wi_,
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffea8);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x16a510);
  std::make_shared<fasttext::QMatrix>();
  std::shared_ptr<fasttext::QMatrix>::operator=
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffeb0,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffea8);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x16a540);
  std::make_shared<fasttext::QMatrix>();
  std::shared_ptr<fasttext::QMatrix>::operator=
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffeb0,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffea8);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x16a570);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a57a);
  Args::load((Args *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if ((*(int *)(in_RDI + 0x8c) == 0xb) &&
     (peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16a5a2), peVar2->model == sup)) {
    peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16a5b2);
    peVar2->maxn = 0;
  }
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&,std::istream&>
            (in_stack_fffffffffffffed8,
             (basic_istream<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffeb0,
             (shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffea8);
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x16a5f6);
  std::istream::read((char *)local_10,(long)local_71);
  if ((local_71[0] & 1) == 0) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16a64f);
    Matrix::load(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  else {
    *(undefined1 *)(in_RDI + 0x88) = 1;
    std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16a62f);
    QMatrix::load(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  if ((local_71[0] & 1) == 0) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16a677);
    bVar1 = Dictionary::isPruned(this_00);
    if (bVar1) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,
                 "Invalid model file.\nPlease download the updated model from www.fasttext.cc.\nSee issue #332 on Github for more information.\n"
                );
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16a6fa);
  std::istream::read((char *)local_10,(long)&peVar2->qout);
  this_04 = local_10;
  if (((*(byte *)(in_RDI + 0x88) & 1) == 0) ||
     (peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16a72b), this_04 = local_10, (peVar2->qout & 1U) == 0)) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16a762);
    Matrix::load(in_stack_ffffffffffffff00,(istream *)this_04);
  }
  else {
    std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16a742);
    QMatrix::load(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this_04 = local_10;
  }
  local_9c = 0;
  qwi = &local_98;
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (int *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)in_stack_fffffffffffffeb0,
             (shared_ptr<fasttext::Model> *)in_stack_fffffffffffffea8);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x16a7cc);
  bVar4 = *(byte *)(in_RDI + 0x88);
  peVar3 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16a7e5);
  peVar3->quant_ = (bool)(bVar4 & 1);
  std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a7fc);
  std::shared_ptr<fasttext::QMatrix>::shared_ptr
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffeb0,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffea8);
  type = (entry_type)((ulong)local_c0 >> 0x38);
  std::shared_ptr<fasttext::QMatrix>::shared_ptr
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffeb0,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffea8);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16a841);
  Model::setQuantizePointer
            ((Model *)CONCAT17(bVar4,in_stack_fffffffffffffed0),qwi,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffec0,(bool)qout);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x16a86e);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x16a87b);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16a885);
  if (peVar2->model == sup) {
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16a89d);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16a8b0);
    this_03 = (vector<long,_std::allocator<long>_> *)(local_f0 + 0x18);
    Dictionary::getCounts(this_04,type);
    Model::setTargetCounts
              (in_stack_fffffffffffffeb0,
               (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffea8);
    std::vector<long,_std::allocator<long>_>::~vector(this_03);
  }
  else {
    peVar3 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16a951);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16a963);
    this_02 = (Model *)local_f0;
    Dictionary::getCounts(this_04,type);
    Model::setTargetCounts(this_02,(vector<long,_std::allocator<long>_> *)peVar3);
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffec0);
  }
  return;
}

Assistant:

void FastText::loadModel(std::istream& in) {
  args_ = std::make_shared<Args>();
  input_ = std::make_shared<Matrix>();
  output_ = std::make_shared<Matrix>();
  qinput_ = std::make_shared<QMatrix>();
  qoutput_ = std::make_shared<QMatrix>();
  args_->load(in);
  if (version == 11 && args_->model == model_name::sup) {
    // backward compatibility: old supervised models do not use char ngrams.
    args_->maxn = 0;
  }
  dict_ = std::make_shared<Dictionary>(args_, in);

  bool quant_input;
  in.read((char*) &quant_input, sizeof(bool));
  if (quant_input) {
    quant_ = true;
    qinput_->load(in);
  } else {
    input_->load(in);
  }

  if (!quant_input && dict_->isPruned()) {
    throw std::invalid_argument(
        "Invalid model file.\n"
        "Please download the updated model from www.fasttext.cc.\n"
        "See issue #332 on Github for more information.\n");
  }

  in.read((char*) &args_->qout, sizeof(bool));
  if (quant_ && args_->qout) {
    qoutput_->load(in);
  } else {
    output_->load(in);
  }

  model_ = std::make_shared<Model>(input_, output_, args_, 0);
  model_->quant_ = quant_;
  model_->setQuantizePointer(qinput_, qoutput_, args_->qout);

  if (args_->model == model_name::sup) {
    model_->setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model_->setTargetCounts(dict_->getCounts(entry_type::word));
  }
}